

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeQPRRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  uint in_ESI;
  MCInst *in_RDI;
  uint Register;
  DecodeStatus local_4;
  
  if ((in_ESI < 0x20) && ((in_ESI & 1) == 0)) {
    MCOperand_CreateReg0(in_RDI,(uint)QPRDecoderTable[in_ESI >> 1]);
    local_4 = MCDisassembler_Success;
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeQPRRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	unsigned Register;
	if (RegNo > 31 || (RegNo & 1) != 0)
		return MCDisassembler_Fail;
	RegNo >>= 1;

	Register = QPRDecoderTable[RegNo];
	MCOperand_CreateReg0(Inst, Register);
	return MCDisassembler_Success;
}